

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::leS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  BasicType BVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  BVar5 = wasm::Type::getBasic(&this->type);
  if (BVar5 == i64) {
    lVar3 = (this->field_0).i64;
    lVar4 = (other->field_0).i64;
    bVar8 = SBORROW8(lVar3,lVar4);
    bVar7 = lVar3 - lVar4 < 0;
    bVar6 = lVar3 == lVar4;
  }
  else {
    if (BVar5 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x569);
    }
    iVar2 = (this->field_0).i32;
    iVar1 = (other->field_0).i32;
    bVar8 = SBORROW4(iVar2,iVar1);
    bVar7 = iVar2 - iVar1 < 0;
    bVar6 = iVar2 == iVar1;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar6 || bVar8 != bVar7);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::leS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 <= other.i32);
    case Type::i64:
      return Literal(i64 <= other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}